

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_loopfilter(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AV1_COMMON *in_RDI;
  int i_1;
  int i;
  loopfilter *lf;
  int num_planes;
  int local_28;
  int in_stack_ffffffffffffffdc;
  aom_read_bit_buffer *rb_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = av1_num_planes(in_RDI);
  rb_00 = (aom_read_bit_buffer *)&in_RDI->lf;
  if ((((in_RDI->features).allow_intrabc & 1U) == 0) &&
     (((in_RDI->features).coded_lossless & 1U) == 0)) {
    if (in_RDI->prev_frame == (RefCntBuffer *)0x0) {
      av1_set_default_ref_deltas((in_RDI->lf).ref_deltas);
      av1_set_default_mode_deltas((int8_t *)((long)&rb_00[1].bit_buffer + 6));
    }
    else {
      *(undefined8 *)(in_RDI->lf).ref_deltas = *(undefined8 *)in_RDI->prev_frame->ref_deltas;
      *(undefined2 *)(in_RDI->lf).mode_deltas = *(undefined2 *)in_RDI->prev_frame->mode_deltas;
    }
    iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
    *(int *)&rb_00->bit_buffer = iVar2;
    iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
    *(int *)((long)&rb_00->bit_buffer + 4) = iVar2;
    if ((1 < iVar1) &&
       ((*(int *)&rb_00->bit_buffer != 0 || (*(int *)((long)&rb_00->bit_buffer + 4) != 0)))) {
      iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
      *(int *)&rb_00->bit_buffer_end = iVar2;
      iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
      *(int *)((long)&rb_00->bit_buffer_end + 4) = iVar2;
    }
    iVar2 = aom_rb_read_literal(rb_00,in_stack_ffffffffffffffdc);
    *(int *)&rb_00->error_handler = iVar2;
    *(undefined1 *)((long)&rb_00->error_handler + 5) = 0;
    iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    *(char *)((long)&rb_00->error_handler + 4) = (char)iVar2;
    if (*(char *)((long)&rb_00->error_handler + 4) != '\0') {
      iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
      *(char *)((long)&rb_00->error_handler + 5) = (char)iVar2;
      if (*(char *)((long)&rb_00->error_handler + 5) != '\0') {
        for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
          iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
          if (iVar3 != 0) {
            iVar3 = aom_rb_read_inv_signed_literal(rb_00,iVar2);
            *(char *)((long)&rb_00->error_handler + (long)iVar2 + 6) = (char)iVar3;
          }
        }
        for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
          iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
          if (iVar3 != 0) {
            iVar3 = aom_rb_read_inv_signed_literal(rb_00,iVar2);
            *(char *)((long)&rb_00[1].bit_buffer + (long)local_28 + 6) = (char)iVar3;
          }
        }
      }
    }
    *(undefined8 *)in_RDI->cur_frame->ref_deltas = *(undefined8 *)((long)&rb_00->error_handler + 6);
    *(undefined2 *)in_RDI->cur_frame->mode_deltas = *(undefined2 *)((long)&rb_00[1].bit_buffer + 6);
  }
  else {
    av1_set_default_ref_deltas(in_RDI->cur_frame->ref_deltas);
    av1_set_default_mode_deltas(in_RDI->cur_frame->mode_deltas);
  }
  return;
}

Assistant:

static inline void setup_loopfilter(AV1_COMMON *cm,
                                    struct aom_read_bit_buffer *rb) {
  const int num_planes = av1_num_planes(cm);
  struct loopfilter *lf = &cm->lf;

  if (cm->features.allow_intrabc || cm->features.coded_lossless) {
    // write default deltas to frame buffer
    av1_set_default_ref_deltas(cm->cur_frame->ref_deltas);
    av1_set_default_mode_deltas(cm->cur_frame->mode_deltas);
    return;
  }
  assert(!cm->features.coded_lossless);
  if (cm->prev_frame) {
    // write deltas to frame buffer
    memcpy(lf->ref_deltas, cm->prev_frame->ref_deltas, REF_FRAMES);
    memcpy(lf->mode_deltas, cm->prev_frame->mode_deltas, MAX_MODE_LF_DELTAS);
  } else {
    av1_set_default_ref_deltas(lf->ref_deltas);
    av1_set_default_mode_deltas(lf->mode_deltas);
  }
  lf->filter_level[0] = aom_rb_read_literal(rb, 6);
  lf->filter_level[1] = aom_rb_read_literal(rb, 6);
  if (num_planes > 1) {
    if (lf->filter_level[0] || lf->filter_level[1]) {
      lf->filter_level_u = aom_rb_read_literal(rb, 6);
      lf->filter_level_v = aom_rb_read_literal(rb, 6);
    }
  }
  lf->sharpness_level = aom_rb_read_literal(rb, 3);

  // Read in loop filter deltas applied at the MB level based on mode or ref
  // frame.
  lf->mode_ref_delta_update = 0;

  lf->mode_ref_delta_enabled = aom_rb_read_bit(rb);
  if (lf->mode_ref_delta_enabled) {
    lf->mode_ref_delta_update = aom_rb_read_bit(rb);
    if (lf->mode_ref_delta_update) {
      for (int i = 0; i < REF_FRAMES; i++)
        if (aom_rb_read_bit(rb))
          lf->ref_deltas[i] = aom_rb_read_inv_signed_literal(rb, 6);

      for (int i = 0; i < MAX_MODE_LF_DELTAS; i++)
        if (aom_rb_read_bit(rb))
          lf->mode_deltas[i] = aom_rb_read_inv_signed_literal(rb, 6);
    }
  }

  // write deltas to frame buffer
  memcpy(cm->cur_frame->ref_deltas, lf->ref_deltas, REF_FRAMES);
  memcpy(cm->cur_frame->mode_deltas, lf->mode_deltas, MAX_MODE_LF_DELTAS);
}